

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O3

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_TypedTest2_x_iutest_x_Mul2_Test,_iutest::detail::TypeList1<float>_>::
TypeParamTestInstance
          (TypeParamTestInstance<iu_TypedTest2_x_iutest_x_Mul2_Test,_iutest::detail::TypeList1<float>_>
           *this,string *testsuite,char *name,char *file,int line)

{
  TestSuite *this_00;
  UnitTest *pUVar1;
  
  EachTest<iutest::detail::TypeList1<float>,_void>::EachTest
            (&this->m_tests,testsuite,name,0,file,line);
  pUVar1 = UnitTest::instance();
  this_00 = (this->m_tests).m_mediator.super_iuITestSuiteMediator.m_test_suite;
  (pUVar1->super_UnitTestImpl).m_total_test_num = (pUVar1->super_UnitTestImpl).m_total_test_num + 1;
  TestSuite::push_back(this_00,&(this->m_tests).m_info);
  return;
}

Assistant:

TypeParamTestInstance(const std::string& testsuite, const char* name, const char* file, int line)
        : m_tests(testsuite, name, 0, file, line)
    {
        m_tests.AddTest();
    }